

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

int set_paramptr(FILE *paramfile)

{
  rpf_t **pprVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  int (*paiVar10) [16];
  rpf_t *prVar11;
  undefined *puVar12;
  int j;
  long lVar13;
  rpf_t *(*paprVar14) [16];
  char (*pacVar15) [20];
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  double (*padVar20) [16];
  char (*__dest) [20];
  char *pcVar21;
  byte bVar22;
  undefined4 uVar23;
  ulong uStack_2760;
  char *local_2748;
  char name [32];
  char value_str [100];
  char param_names [73] [20];
  variables_t variables [257];
  char variable_names [37] [20];
  char param_names1 [73] [24];
  char param_names0 [73] [24];
  
  pacVar15 = param_names;
  memcpy(pacVar15,"VERSION",0x5b4);
  memcpy(param_names0,"VERSION",0x6d8);
  memcpy(param_names1,"VERSION",0x6d8);
  __dest = variable_names;
  memcpy(__dest,&DAT_001152f0,0x2e4);
  padVar20 = g_P;
  for (lVar16 = 0; lVar16 != 0x6d8; lVar16 = lVar16 + 0x18) {
    pcVar21 = param_names0[0] + lVar16;
    sVar9 = strlen(pcVar21);
    builtin_strncpy(param_names0[0] + sVar9 + lVar16,"[0]",4);
    pcVar17 = param_names1[0] + lVar16;
    sVar9 = strlen(pcVar17);
    builtin_strncpy(param_names1[0] + sVar9 + lVar16,"[1]",4);
    *(char (**) [20])((long)&variables[0].name + lVar16 * 2) = pacVar15;
    *(double (**) [16])((long)&variables[0].pointer + lVar16 * 2) = padVar20;
    *(char **)((long)&variables[1].name + lVar16 * 2) = pcVar21;
    *(double (**) [16])((long)&variables[1].pointer + lVar16 * 2) = padVar20;
    *(char **)((long)&variables[2].name + lVar16 * 2) = pcVar17;
    *(double **)((long)&variables[2].pointer + lVar16 * 2) = *padVar20 + 1;
    padVar20 = padVar20 + 1;
    pacVar15 = pacVar15 + 1;
  }
  for (lVar16 = 0xdb0; lVar16 != 0x1000; lVar16 = lVar16 + 0x10) {
    *(char (**) [20])((long)&variables[0].name + lVar16) = __dest;
    __dest = __dest + 1;
  }
  variables[0xdb].pointer = &get_odometry_ptr()->x;
  variables[0xdc].pointer = &((OdometryPtr)variables[0xdb].pointer)->y;
  variables[0xdd].pointer = &((OdometryPtr)variables[0xdb].pointer)->theta;
  variables[0xde].pointer = &((OdometryPtr)variables[0xdb].pointer)->v;
  variables[0xdf].pointer = &((OdometryPtr)variables[0xdb].pointer)->w;
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 8) {
    *(long *)(variable_names[-0x1a] + lVar16 * 2) =
         (long)((OdometryPtr)variables[0xdb].pointer)->wvel + lVar16;
  }
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 8) {
    *(long *)(variable_names[-0xe] + lVar16 * 2 + 0x10) =
         (long)((OdometryPtr)variables[0xdb].pointer)->wang + lVar16;
  }
  variables[0x100].name = (char *)0x0;
  variables[0x100].pointer = (double *)0x0;
  paiVar10 = g_P_changed;
  for (lVar16 = 0; lVar16 != 0x49; lVar16 = lVar16 + 1) {
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      (*paiVar10)[lVar13] = 0;
    }
    paiVar10 = paiVar10 + 1;
  }
  if (g_param_init != 0) {
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      g_P_changed[3][lVar16] = 1;
      g_param.motor_enable[lVar16] = 0;
    }
    padVar20 = g_P;
    paiVar10 = g_P_set;
    paprVar14 = g_Pf;
    for (lVar16 = 0; lVar16 != 0x49; lVar16 = lVar16 + 1) {
      for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
        (*padVar20)[lVar13] = 0.0;
        (*paiVar10)[lVar13] = 0;
        (*paprVar14)[lVar13] = (rpf_t *)0x0;
      }
      padVar20 = padVar20 + 1;
      paiVar10 = paiVar10 + 1;
      paprVar14 = paprVar14 + 1;
    }
  }
  sVar9 = 0;
  bVar22 = 0;
  uStack_2760 = 0x49;
  uVar7 = 0;
  bVar3 = false;
LAB_0010c1bd:
  uVar5 = getc((FILE *)paramfile);
  uVar6 = uVar5;
  if (uVar5 == 0xffffffff) {
    uVar6 = 10;
  }
  if (5 < bVar22) goto joined_r0x0010c5b5;
  iVar8 = (int)sVar9;
  iVar19 = (int)uStack_2760;
  cVar4 = (char)uVar6;
  switch(bVar22) {
  case 0:
    if ((((uVar6 & 0xffffffdf) - 0x41 < 0x1a) || (bVar22 = uVar6 == 0x23, uVar5 == 0x5f)) ||
       (uVar5 == 0x2d)) {
      sVar9 = 1;
      name[0] = cVar4;
LAB_0010c37f:
      bVar22 = 2;
    }
    break;
  case 1:
    bVar22 = uVar6 != 10;
    break;
  case 2:
    name[iVar8] = cVar4;
    if ((((uVar6 == 0x5f) || (0xffffffe5 < (uVar6 & 0xffffffdf) - 0x5b)) ||
        (uVar6 - 0x2d < 2 || uVar6 - 0x30 < 10)) ||
       ((uVar5 - 0x2d < 0x31 && ((0x1400000000001U >> ((ulong)(uVar5 - 0x2d) & 0x3f) & 1) != 0)))) {
      sVar9 = (size_t)(iVar8 + 1);
      goto LAB_0010c37f;
    }
    name[iVar8] = '\0';
    sVar9 = 0;
LAB_0010c90b:
    bVar22 = 3;
    break;
  case 3:
    if (uVar6 - 0x3a < 0xfffffff6 && uVar6 - 0x2f < 0xfffffffe) {
      if (uVar6 != 0x3d) goto LAB_0010c90b;
      strcpy(value_str,name);
      sVar9 = strlen(value_str);
      (value_str + sVar9)[0] = '=';
      (value_str + sVar9)[1] = '\0';
      sVar9 = strlen(value_str);
      bVar22 = 5;
    }
    else {
      sVar9 = 1;
      bVar22 = 4;
      value_str[0] = cVar4;
    }
    pcVar17 = strchr(name,0x5b);
    if (pcVar17 == (char *)0x0) {
      pcVar21 = (char *)0x0;
      local_2748 = (char *)0x0;
      uVar7 = 0xffffffff;
    }
    else {
      local_2748 = strchr(name,0x5d);
      if (local_2748 == (char *)0x0) {
        yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",name);
        bVar22 = 4;
        uStack_2760 = 0x49;
        bVar3 = true;
        goto LAB_0010c1bd;
      }
      pcVar21 = pcVar17 + 1;
      *pcVar17 = '\0';
      *local_2748 = '\0';
      uVar7 = atoi(pcVar21);
    }
    pacVar15 = param_names;
    for (uStack_2760 = 0; uStack_2760 != 0x49; uStack_2760 = uStack_2760 + 1) {
      iVar8 = strcmp(name,*pacVar15);
      if (iVar8 == 0) {
        if (uStack_2760 == 0x10) {
          puVar12 = &DAT_001155ec;
        }
        else {
          puVar12 = &DAT_001155e0;
          if (uStack_2760 != 0x11) goto LAB_0010c75b;
        }
        uVar7 = *(uint *)(puVar12 + 8);
        yprintf(OUTPUT_LV_WARNING,"Parameter alias: %s -> %s[%d]\n",pacVar15);
        uStack_2760 = 0xf;
        goto LAB_0010c75b;
      }
      pacVar15 = pacVar15 + 1;
    }
    uStack_2760 = 0x49;
LAB_0010c75b:
    if (pcVar21 != (char *)0x0) {
      pcVar21[-1] = '[';
      *local_2748 = ']';
    }
    break;
  case 4:
    if (uVar6 - 0x2f < 0xfffffffe && uVar6 - 0x3a < 0xfffffff6) {
      value_str[iVar8] = '\0';
      if (iVar19 == 0x49) {
LAB_0010c414:
        yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",name);
        goto joined_r0x0010c951;
      }
      if (uVar7 == 0xffffffff) {
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 4) {
          dVar2 = strtod(value_str,(char **)0x0);
          *(double *)((long)g_P[iVar19] + lVar16 * 2) = dVar2;
          *(undefined4 *)((long)g_P_set[iVar19] + lVar16) = 1;
          *(undefined4 *)((long)g_P_changed[iVar19] + lVar16) = 1;
          if (*(long *)((long)g_Pf[iVar19] + lVar16 * 2) != 0) {
            formula_free();
            *(undefined8 *)((long)g_Pf[iVar19] + lVar16 * 2) = 0;
          }
        }
        yprintf(OUTPUT_LV_DEBUG,"%d %s %f\n",SUB84(g_P[iVar19][0],0),uStack_2760 & 0xffffffff);
LAB_0010c8e2:
        uVar7 = 0xffffffff;
joined_r0x0010c5b5:
        bVar22 = 0;
        uStack_2760 = 0x49;
        sVar9 = 0;
      }
      else {
        dVar2 = strtod(value_str,(char **)0x0);
        uVar23 = SUB84(dVar2,0);
        g_P[iVar19][(int)uVar7] = dVar2;
        g_P_set[iVar19][(int)uVar7] = 1;
        g_P_changed[iVar19][(int)uVar7] = 1;
        g_param.motor_enable[(int)uVar7] = 1;
        if (g_Pf[iVar19][(int)uVar7] != (rpf_t *)0x0) {
          formula_free();
          g_Pf[iVar19][(int)uVar7] = (rpf_t *)0x0;
          uVar23 = SUB84(g_P[iVar19][(int)uVar7],0);
        }
        yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] %f\n",uVar23,uStack_2760 & 0xffffffff,
                param_names + iVar19,(ulong)uVar7);
        sVar9 = 0;
        bVar22 = 0;
        uStack_2760 = 0x49;
      }
    }
    else {
      sVar9 = (size_t)(iVar8 + 1);
      value_str[iVar8] = cVar4;
      bVar22 = 4;
    }
    break;
  case 5:
    if ((uVar6 != 0x23) && (uVar6 != 10)) {
      sVar9 = (size_t)(iVar8 + 1);
      value_str[iVar8] = cVar4;
      bVar22 = 5;
      break;
    }
    value_str[iVar8] = '\0';
    if (iVar19 == 0x49) goto LAB_0010c414;
    if (uVar7 == 0xffffffff) {
      lVar13 = 0;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        g_P[iVar19][lVar16] = 0.0;
        g_P_set[iVar19][lVar16] = 1;
        if (g_Pf[iVar19][lVar16] != (rpf_t *)0x0) {
          formula_free();
        }
        formula(value_str,(long)g_Pf[iVar19] + lVar13,variables);
        lVar13 = lVar13 + 8;
      }
      if (g_Pf[iVar19][0] != (rpf_t *)0x0) {
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          prVar11 = (rpf_t *)formula_optimize(g_Pf[iVar19][lVar16]);
          g_Pf[iVar19][lVar16] = prVar11;
        }
        yprintf(OUTPUT_LV_DEBUG,"%d %s ",uStack_2760 & 0xffffffff);
        if (OUTPUT_LV_INFO < g_param.output_lv) {
          formula_print(_stderr,g_Pf[iVar19][0]);
        }
        yprintf(OUTPUT_LV_DEBUG,"\n");
        goto LAB_0010c8e2;
      }
      yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",value_str);
      uVar7 = 0xffffffff;
    }
    else {
      g_P[iVar19][(int)uVar7] = 0.0;
      g_P_set[iVar19][(int)uVar7] = 1;
      if (g_Pf[iVar19][(int)uVar7] != (rpf_t *)0x0) {
        formula_free();
      }
      pprVar1 = g_Pf[iVar19] + (int)uVar7;
      formula(value_str,pprVar1,variables);
      if (*pprVar1 != (rpf_t *)0x0) {
        prVar11 = (rpf_t *)formula_optimize();
        *pprVar1 = prVar11;
        yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] ",uStack_2760 & 0xffffffff,param_names + iVar19,uVar7);
        if (OUTPUT_LV_INFO < g_param.output_lv) {
          formula_print(_stderr,*pprVar1);
        }
        yprintf(OUTPUT_LV_DEBUG,"\n");
        goto joined_r0x0010c5b5;
      }
      yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",value_str);
    }
joined_r0x0010c951:
    bVar22 = 0;
    bVar3 = true;
    uStack_2760 = 0x49;
    sVar9 = 0;
    if (uVar5 == 0xffffffff) goto LAB_0010c957;
    goto LAB_0010c1bd;
  }
joined_r0x0010c5b5:
  if (uVar5 == 0xffffffff) goto LAB_0010c95b;
  goto LAB_0010c1bd;
LAB_0010c957:
  bVar3 = true;
LAB_0010c95b:
  fclose((FILE *)paramfile);
  if (4.0 <= g_P[0][0]) {
    if (g_P[0][0] <= 5.0) {
      paiVar10 = g_P_set;
      for (lVar16 = 0; lVar16 != 0x49; lVar16 = lVar16 + 1) {
        for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
          if (((g_param.motor_enable[lVar13] != 0) && ((&DAT_001151c0)[lVar16] != 0)) &&
             ((*paiVar10)[lVar13] == 0)) {
            yprintf(OUTPUT_LV_ERROR,"Error: %s[%d] undefined!\n",param_names + lVar16);
            bVar3 = true;
          }
        }
        paiVar10 = paiVar10 + 1;
      }
      if (!bVar3) {
        g_param.num_motor_enable = 0;
        iVar8 = 0;
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          if (g_param.motor_enable[lVar16] != 0) {
            g_param.num_motor_enable = iVar8 + 1;
            iVar8 = g_param.num_motor_enable;
          }
        }
        if (iVar8 == 0) {
          g_param.motor_enable[0] = 1;
          g_param.motor_enable[1] = 1;
          g_param.num_motor_enable = 2;
        }
        for (uVar18 = 0; uVar18 != 0x10; uVar18 = uVar18 + 1) {
          if (g_param.motor_enable[uVar18] != 0) {
            if ((g_P_changed[0x40][uVar18] != 0) && (g_P_set[0x40][uVar18] != 0)) {
              if (g_P[0][0] < 5.0) {
                pcVar17 = 
                "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n"
                ;
                goto LAB_0010cdfb;
              }
              yprintf(OUTPUT_LV_WARNING,
                      "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n The behavior of this parameter may be changed in the future update.\n"
                     );
            }
            if (g_P_set[0x27][uVar18] == 0) {
              yprintf(OUTPUT_LV_WARNING,
                      "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n",
                      uVar18 & 0xffffffff,uVar18 & 0xffffffff);
              g_P[0x27][uVar18] = g_P[0x20][uVar18];
              g_P_changed[0x27][uVar18] = g_P_changed[0x20][uVar18];
            }
            if (g_P_set[0x3b][uVar18] == 0) {
              uVar7 = 0x3ff00000;
              if (1 < uVar18) {
                uVar7 = 0;
              }
              if ((g_P[0x3b][uVar18] != (double)((ulong)uVar7 << 0x20)) ||
                 (NAN(g_P[0x3b][uVar18]) || NAN((double)((ulong)uVar7 << 0x20)))) {
                g_P_changed[0x3b][uVar18] = 1;
              }
              g_P[0x3b][uVar18] = (double)((ulong)uVar7 << 0x20);
            }
            if (g_P_set[5][uVar18] == 0) {
              if ((g_P[5][uVar18] != 2.0) || (NAN(g_P[5][uVar18]))) {
                g_P_changed[5][uVar18] = 1;
              }
              g_P[5][uVar18] = 2.0;
            }
            if (g_P_set[0x45][uVar18] == 0) {
              if ((g_P[0x45][uVar18] != 1.0) || (NAN(g_P[0x45][uVar18]))) {
                g_P_changed[0x45][uVar18] = 1;
              }
              g_P[0x45][uVar18] = 1.0;
            }
            if (g_P_set[0x40][uVar18] == 0) {
              if ((g_P[0x40][uVar18] != 1.0) || (NAN(g_P[0x40][uVar18]))) {
                g_P_changed[0x40][uVar18] = 1;
              }
              g_P[0x40][uVar18] = 1.0;
            }
            if (g_P_set[0x46][uVar18] == 0) {
              g_P[0x46][uVar18] = 0.3;
            }
            g_P[1][uVar18] = 1.0 / g_P[2][uVar18];
            g_P_changed[1][uVar18] = g_P_changed[2][uVar18];
          }
        }
        if (g_P_set[0x47][0] == 0) {
          g_P[0x47][0] = g_P[0x13][0];
          bVar3 = true;
        }
        else {
          bVar3 = true;
          if (g_P[0x47][0] <= 0.0) {
            bVar3 = false;
            yprintf(OUTPUT_LV_ERROR,"ERROR: MAX_TIME_JUMP must be > 0.0.\n");
          }
        }
        if (g_P_set[0x48][0] == 0) {
          g_P[0x48][0] = g_P[0x13][0];
        }
        else if (g_P[0x48][0] <= 0.0) {
          pcVar17 = "ERROR: -MAX_TIME_JUMP must be > 0.0.\n";
LAB_0010cdfb:
          yprintf(OUTPUT_LV_ERROR,pcVar17);
          return 0;
        }
        if (bVar3) {
          calc_param_inertia2ff();
          builtin_strncpy(g_state,"\x01\x01\x01\x01",4);
          yprintf(OUTPUT_LV_DEBUG,"Info: %d motors defined\n",(ulong)(uint)g_param.num_motor_enable)
          ;
          return 1;
        }
      }
      return 0;
    }
    yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is unsupported!\n");
    yprintf(OUTPUT_LV_ERROR,"Error: Please install newer version of YP-Spur.\n");
    pcVar17 = "Error: This program supports %3.1f.\n";
  }
  else {
    yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is too old!\n");
    pcVar17 = "Error: This program requires %3.1f.\n";
  }
  yprintf(OUTPUT_LV_ERROR,pcVar17,0);
  return 0;
}

Assistant:

int set_paramptr(FILE* paramfile)
{
  char param_names[YP_PARAM_NUM][20] = YP_PARAM_NAME;
  char param_names0[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  char param_names1[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  int param_necessary[YP_PARAM_NUM] = YP_PARAM_NECESSARY;
#define VARIABLE_NUM 37
  char variable_names[VARIABLE_NUM][20] =
      {
          "X",
          "Y",
          "THETA",
          "V",
          "W",
          "WHEEL_VEL[0]",
          "WHEEL_VEL[1]",
          "WHEEL_VEL[2]",
          "WHEEL_VEL[3]",
          "WHEEL_VEL[4]",
          "WHEEL_VEL[5]",
          "WHEEL_VEL[6]",
          "WHEEL_VEL[7]",
          "WHEEL_VEL[8]",
          "WHEEL_VEL[9]",
          "WHEEL_VEL[10]",
          "WHEEL_VEL[11]",
          "WHEEL_VEL[12]",
          "WHEEL_VEL[13]",
          "WHEEL_VEL[14]",
          "WHEEL_VEL[15]",
          "WHEEL_ANGLE[0]",
          "WHEEL_ANGLE[1]",
          "WHEEL_ANGLE[2]",
          "WHEEL_ANGLE[3]",
          "WHEEL_ANGLE[4]",
          "WHEEL_ANGLE[5]",
          "WHEEL_ANGLE[6]",
          "WHEEL_ANGLE[7]",
          "WHEEL_ANGLE[8]",
          "WHEEL_ANGLE[9]",
          "WHEEL_ANGLE[10]",
          "WHEEL_ANGLE[11]",
          "WHEEL_ANGLE[12]",
          "WHEEL_ANGLE[13]",
          "WHEEL_ANGLE[14]",
          "WHEEL_ANGLE[15]",
      };
  struct variables_t variables[YP_PARAM_NUM * 3 + 1 + VARIABLE_NUM];
  struct
  {
    YPSpur_param alias;
    YPSpur_param param;
    int motor;
  } param_alias[YP_PARAM_ALIAS_NUM] = YP_PARAM_ALIAS;
  char name[32], value_str[100];
  int i, j, c;
  int str_wp;
  int read_state;
  int param_num, motor_num;
  OdometryPtr odm;
  int param_error = 0;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    strcat(param_names0[i], "[0]");
    strcat(param_names1[i], "[1]");
    variables[i * 3 + 0].name = param_names[i];
    variables[i * 3 + 0].pointer = &g_P[i][0];
    variables[i * 3 + 1].name = param_names0[i];
    variables[i * 3 + 1].pointer = &g_P[i][0];
    variables[i * 3 + 2].name = param_names1[i];
    variables[i * 3 + 2].pointer = &g_P[i][1];
  }
  i = i * 3;
  for (j = 0; j < VARIABLE_NUM; j++)
  {
    variables[i + j].name = variable_names[j];
  }
  odm = get_odometry_ptr();
  variables[i++].pointer = &odm->x;
  variables[i++].pointer = &odm->y;
  variables[i++].pointer = &odm->theta;
  variables[i++].pointer = &odm->v;
  variables[i++].pointer = &odm->w;
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wvel[j];
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wang[j];
  variables[i].name = NULL;
  variables[i].pointer = NULL;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[i][j] = 0;
    }
  }
  if (g_param_init)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[YP_PARAM_PWM_MAX][j] = 1;
      g_param.motor_enable[j] = 0;
    }
    // パラメータの初期化
    for (i = 0; i < YP_PARAM_NUM; i++)
    {
      for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
      {
        g_P[i][j] = 0;
        g_P_set[i][j] = 0;
        g_Pf[i][j] = NULL;
      }
    }
  }

  // パラメータファイルの読み込み
  read_state = 0;
  str_wp = 0;
  motor_num = 0;
  param_num = YP_PARAM_NUM;
  while (1)
  {
    int eof = 0;

    c = getc(paramfile);
    if (c == EOF)
    {
      eof = 1;
      c = '\n';
    }

    switch (read_state)
    {
      case 0:
        /* - */
        if (c == '#')
        {
          read_state = 1;
        }
        if (is_character(c) || c == '-')
        {
          name[0] = c;
          read_state = 2;
          str_wp = 1;
        }
        break;
      case 1: /* comment */
        if (c == '\n')
        {
          read_state = 0;
        }
        break;
      case 2: /* name */
        name[str_wp] = c;
        if (!(is_character(c) || is_number(c) || c == '[' || c == ']' || c == '-'))
        {
          name[str_wp] = 0;
          read_state = 3;
          str_wp = 0;
        }
        else
        {
          str_wp++;
        }
        break;
      case 3: /* value */
        if (is_number(c))
        {
          str_wp = 0;
          value_str[str_wp] = c;
          str_wp++;
          read_state = 4;
        }
        else if (c == '=')
        {
          strcpy(value_str, name);
          strcat(value_str, "=");
          str_wp = strlen(value_str);
          read_state = 5;
        }
        if (read_state != 3)
        {
          char* num_start;
          char* num_end = NULL;
          int num;

          param_num = YP_PARAM_NUM;
          num = -1;

          num_start = strchr(name, '[');
          if (num_start)
          {
            num_start++;
            num_end = strchr(name, ']');
            if (!num_end)
            {
              read_state = 4;
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
              param_error = 1;
              continue;
            }
            *(num_start - 1) = 0;
            *num_end = 0;
            num = atoi(num_start);
          }
          motor_num = num;
          for (i = 0; i < YP_PARAM_NUM; i++)
          {
            if (!strcmp(name, param_names[i]))
            {
              int j;
              for (j = 0; j < YP_PARAM_ALIAS_NUM; j++)
              {
                if (i == param_alias[j].alias)
                {
                  yprintf(OUTPUT_LV_WARNING, "Parameter alias: %s -> %s[%d]\n",
                          param_names[i], param_names[param_alias[j].param], param_alias[j].motor);
                  i = param_alias[j].param;
                  motor_num = param_alias[j].motor;
                  break;
                }
              }
              param_num = i;
              break;
            }
          }
          if (num_start)
          {
            *(num_start - 1) = '[';
            *num_end = ']';
          }
        }
        break;
      case 4: /* value */
        if (!is_number(c))
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = strtod(value_str, 0);
              g_P_set[param_num][j] = 1;
              g_P_changed[param_num][j] = 1;
              if (g_Pf[param_num][j])
              {
                formula_free(g_Pf[param_num][j]);
                g_Pf[param_num][j] = NULL;
              }
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s %f\n", param_num, param_names[param_num], g_P[param_num][0]);
          }
          else
          {
            g_P[param_num][motor_num] = strtod(value_str, 0);
            g_P_set[param_num][motor_num] = 1;
            g_P_changed[param_num][motor_num] = 1;
            g_param.motor_enable[motor_num] = 1;
            if (g_Pf[param_num][motor_num])
            {
              formula_free(g_Pf[param_num][motor_num]);
              g_Pf[param_num][motor_num] = NULL;
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] %f\n", param_num, param_names[param_num], motor_num,
                    g_P[param_num][motor_num]);
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
      case 5: /* value */
        if (c == '#' || c == '\n')
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = 0;
              g_P_set[param_num][j] = 1;
              if (g_Pf[param_num][j])
                formula_free(g_Pf[param_num][j]);
              formula(value_str, &g_Pf[param_num][j], variables);
            }
            if (g_Pf[param_num][0] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
              {
                g_Pf[param_num][j] = formula_optimize(g_Pf[param_num][j]);
              }
              yprintf(OUTPUT_LV_DEBUG, "%d %s ", param_num, param_names[param_num]);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][0]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          else
          {
            g_P[param_num][motor_num] = 0;
            g_P_set[param_num][motor_num] = 1;
            if (g_Pf[param_num][motor_num])
              formula_free(g_Pf[param_num][motor_num]);
            formula(value_str, &g_Pf[param_num][motor_num], variables);
            if (g_Pf[param_num][motor_num] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              g_Pf[param_num][motor_num] = formula_optimize(g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] ", param_num, param_names[param_num], motor_num);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
    }
    if (eof)
      break;
  }

  fclose(paramfile);
  if (g_P[YP_PARAM_VERSION][0] < YP_PARAM_REQUIRED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is too old!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program requires %3.1f.\n", YP_PARAM_REQUIRED_VERSION);
    return 0;
  }
  if (g_P[YP_PARAM_VERSION][0] > YP_PARAM_SUPPORTED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is unsupported!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: Please install newer version of YP-Spur.\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program supports %3.1f.\n", YP_PARAM_SUPPORTED_VERSION);
    return 0;
  }

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (!g_param.motor_enable[j])
        continue;
      if (param_necessary[i] && !g_P_set[i][j])
      {
        yprintf(OUTPUT_LV_ERROR, "Error: %s[%d] undefined!\n", param_names[i], j);
        param_error = 1;
      }
    }
  }
  if (param_error)
  {
    return 0;
  }

  g_param.num_motor_enable = 0;
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    // Count motor number
    if (g_param.motor_enable[j])
      g_param.num_motor_enable++;
  }
  if (g_param.num_motor_enable == 0)
  {
    // If all parameters are common among motors, treat num_motor_enable as two
    g_param.motor_enable[0] = g_param.motor_enable[1] = 1;
    g_param.num_motor_enable = 2;
  }

  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;

    // Verify parameter version compatibility
    if (g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] &&
        g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_VERSION][0] < 5.0)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n"
            " Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n");
        return 0;
      }
      yprintf(
          OUTPUT_LV_WARNING,
          "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n"
          " The behavior of this parameter may be changed in the future update.\n");
    }

    // Check and fill undefined parameters
    if (!g_P_set[YP_PARAM_TORQUE_LIMIT][j])
    {
      yprintf(OUTPUT_LV_WARNING, "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n", j, j);
      g_P[YP_PARAM_TORQUE_LIMIT][j] = g_P[YP_PARAM_TORQUE_MAX][j];
      g_P_changed[YP_PARAM_TORQUE_LIMIT][j] = ischanged_p(YP_PARAM_TORQUE_MAX, j);
    }

    if (!g_P_set[YP_PARAM_VEHICLE_CONTROL][j])
    {
      double default_value;
      if (j < 2)
        default_value = 1.0;
      else
        default_value = 0.0;

      if (g_P[YP_PARAM_VEHICLE_CONTROL][j] != default_value)
        g_P_changed[YP_PARAM_VEHICLE_CONTROL][j] = 1;
      g_P[YP_PARAM_VEHICLE_CONTROL][j] = default_value;
    }

    if (!g_P_set[YP_PARAM_ENCODER_TYPE][j])
    {
      if (g_P[YP_PARAM_ENCODER_TYPE][j] != 2.0)
        g_P_changed[YP_PARAM_ENCODER_TYPE][j] = 1;
      g_P[YP_PARAM_ENCODER_TYPE][j] = 2.0;
    }
    if (!g_P_set[YP_PARAM_INDEX_GEAR][j])
    {
      if (g_P[YP_PARAM_INDEX_GEAR][j] != 1.0)
        g_P_changed[YP_PARAM_INDEX_GEAR][j] = 1;
      g_P[YP_PARAM_INDEX_GEAR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_ENCODER_DENOMINATOR][j] != 1.0)
        g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] = 1;
      g_P[YP_PARAM_ENCODER_DENOMINATOR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_DEVICE_TIMEOUT][j])
    {
      // YP_PARAM_DEVICE_TIMEOUT is always sent on reloading.
      // g_P_changed is not needed to be marked.
      g_P[YP_PARAM_DEVICE_TIMEOUT][j] = 0.3;
    }

    // Process internally calculated parameters
    g_P[YP_PARAM_TORQUE_UNIT][j] = 1.0 / g_P[YP_PARAM_TORQUE_FINENESS][j];
    g_P_changed[YP_PARAM_TORQUE_UNIT][j] = ischanged_p(YP_PARAM_TORQUE_FINENESS, j);
  }

  if (g_P_set[YP_PARAM_MAX_TIME_JUMP][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }
  if (g_P_set[YP_PARAM_MAX_TIME_JUMP_NEG][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: -MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }

  if (param_error)
  {
    return 0;
  }

  // パラメータの指定によって自動的に求まるパラメータの計算
  calc_param_inertia2ff();

  /* パラメータを有効にする */
  enable_state(YP_STATE_MOTOR);
  enable_state(YP_STATE_VELOCITY);
  enable_state(YP_STATE_BODY);
  enable_state(YP_STATE_TRACKING);

  yprintf(OUTPUT_LV_DEBUG, "Info: %d motors defined\n", g_param.num_motor_enable);

  return 1;
}